

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::serialize_pipeline_layout
          (Impl *this,Hash hash,VkPipelineLayoutCreateInfo *create_info,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *blob)

{
  pointer __dest;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc;
  Ch *__src;
  Value layouts;
  Value value;
  undefined1 local_128 [16];
  CrtAllocator *pCStack_118;
  char *local_110;
  char *pcStack_108;
  char *local_100;
  size_t local_f8;
  int local_f0;
  bool local_ec;
  Data local_e8;
  Data local_d8;
  CrtAllocator *local_c8;
  CrtAllocator *pCStack_c0;
  char *local_b8;
  char *pcStack_b0;
  char *local_a8;
  size_t local_a0;
  Data local_98;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_88;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMStack_80;
  Stack<rapidjson::CrtAllocator> local_78;
  undefined4 local_48;
  undefined8 local_40;
  
  local_78.stack_ = (char *)0x0;
  local_78.stackTop_ = (char *)0x0;
  local_78.allocator_ = (CrtAllocator *)0x0;
  local_78.ownAllocator_ = (CrtAllocator *)0x0;
  local_88 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  pMStack_80 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  local_98.n = (Number)0x0;
  local_98.s.str = (Ch *)0x0;
  local_78.stackEnd_ = (char *)0x0;
  local_78.initialCapacity_ = 0x400;
  local_48 = 0;
  local_40 = 0;
  alloc = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)operator_new(0x28);
  alloc->chunkHead_ = (ChunkHeader *)0x0;
  alloc->chunk_capacity_ = 0x10000;
  alloc->userBuffer_ = (void *)0x0;
  alloc->baseAllocator_ = (CrtAllocator *)0x0;
  alloc->ownBaseAllocator_ = (CrtAllocator *)0x0;
  local_98.n = (Number)0x0;
  local_98.s.str = (Ch *)0x3000000000000;
  local_d8.n = (Number)0x0;
  local_d8.s.str = (Ch *)0x0;
  local_88 = alloc;
  pMStack_80 = alloc;
  json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            (create_info,alloc,(Value *)&local_d8.s);
  local_e8.n = (Number)0x0;
  local_e8.s.str = (Ch *)0x3000000000000;
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)local_128,hash,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_e8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_128,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,alloc);
  pCStack_c0 = (CrtAllocator *)0x405000000152731;
  local_c8 = (CrtAllocator *)0x7;
  local_128._0_8_ = (Number)0x6;
  local_128._8_8_ = (Ch *)0x1f6000000000000;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_128,alloc);
  local_128._8_8_ = (Ch *)0x4050000001527a6;
  local_128._0_8_ = (Number)0xf;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_128,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_e8.s,alloc);
  local_a8 = (char *)0x0;
  local_b8 = (char *)0x0;
  pcStack_b0 = (char *)0x0;
  local_c8 = (CrtAllocator *)0x0;
  pCStack_c0 = (CrtAllocator *)0x0;
  local_a0 = 0x100;
  local_128._8_8_ = (Ch *)0x0;
  pCStack_118 = (CrtAllocator *)0x0;
  local_110 = (char *)0x0;
  pcStack_108 = (char *)0x0;
  local_100 = (char *)0x0;
  local_f8 = 0x200;
  local_f0 = 0x144;
  local_ec = false;
  local_128._0_8_ = &local_c8;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)&local_98.s,
             (Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *)local_128);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (blob,(long)pcStack_b0 - (long)local_b8);
  __dest = (blob->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __src = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                    ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                     &local_c8);
  memcpy(__dest,__src,(long)pcStack_b0 - (long)local_b8);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy
            ((Stack<rapidjson::CrtAllocator> *)(local_128 + 8));
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy
            ((Stack<rapidjson::CrtAllocator> *)&local_c8);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::Destroy((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             *)&local_98.s);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_78);
  return true;
}

Assistant:

bool StateRecorder::Impl::serialize_pipeline_layout(Hash hash, const VkPipelineLayoutCreateInfo &create_info,
                                                    vector<uint8_t> &blob) const
{
	Document doc;
	doc.SetObject();
	auto &alloc = doc.GetAllocator();

	Value value;
	if (!json_value(create_info, alloc, &value))
		return false;

	Value layouts(kObjectType);
	layouts.AddMember(uint64_string(hash, alloc), value, alloc);

	doc.AddMember("version", FOSSILIZE_FORMAT_VERSION, alloc);
	doc.AddMember("pipelineLayouts", layouts, alloc);

	StringBuffer buffer;
	CustomWriter writer(buffer);
	doc.Accept(writer);

	blob.resize(buffer.GetSize());
	memcpy(blob.data(), buffer.GetString(), buffer.GetSize());
	return true;
}